

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O2

void LDSketch_get_heavy_keys(LDSketch_t *sk,longlong thresh,uchar *keys,longlong *vals,int *num_key)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  longlong lVar4;
  int iVar5;
  int i;
  long lVar6;
  size_t nmemb;
  uchar *key;
  int iVar7;
  uint local_8c;
  allocator local_85;
  int local_84;
  long local_80;
  uchar *local_78;
  LDSketch_t *local_70;
  longlong local_68;
  uint *local_60;
  longlong *local_58;
  int tmp_n;
  undefined4 uStack_4c;
  
  nmemb = 0;
  local_60 = (uint *)num_key;
  local_58 = vals;
  for (lVar6 = 0; lVar6 < (long)sk->h * (long)sk->w; lVar6 = lVar6 + 1) {
    if ((thresh <= sk->tbl[lVar6]->max_value) &&
       (uVar2 = dyn_tbl_length(sk->tbl[lVar6]), (int)nmemb < (int)uVar2)) {
      nmemb = (size_t)uVar2;
    }
  }
  iVar3 = sk->lgn;
  std::__cxx11::string::string((string *)&tmp_n,"tmp heavy keys",&local_85);
  local_78 = (uchar *)safe_calloc(nmemb,(long)(iVar3 / 8),(char *)CONCAT44(uStack_4c,tmp_n));
  std::__cxx11::string::~string((string *)&tmp_n);
  lVar6 = 0;
  local_8c = 0;
  local_70 = sk;
  local_68 = thresh;
  do {
    if ((long)sk->h * (long)sk->w <= lVar6) {
      *local_60 = local_8c;
      return;
    }
    if (thresh <= sk->tbl[lVar6]->max_value) {
      dyn_tbl_get_heavy_key(sk->tbl[lVar6],thresh,local_78,&tmp_n);
      local_80 = lVar6;
      for (iVar3 = 0; lVar6 = local_80, iVar3 < tmp_n; iVar3 = iVar3 + 1) {
        iVar1 = sk->lgn;
        key = local_78 + (iVar1 * iVar3) / 8;
        iVar7 = (~((int)local_8c >> 0x1f) & local_8c) + 1;
        iVar5 = 0;
        local_84 = iVar3;
        while (sk = local_70, iVar7 = iVar7 + -1, iVar7 != 0) {
          iVar3 = iVar5 / 8;
          iVar5 = iVar5 + iVar1;
          iVar3 = bcmp(key,keys + iVar3,(long)(iVar1 / 8));
          lVar6 = local_80;
          thresh = local_68;
          sk = local_70;
          if (iVar3 == 0) goto LAB_00104b28;
        }
        lVar4 = LDSketch_up_estimate(local_70,key);
        thresh = local_68;
        iVar3 = local_84;
        if (local_68 <= lVar4) {
          iVar5 = sk->lgn;
          memcpy(keys + (int)(iVar5 * local_8c) / 8,local_78 + (iVar5 * local_84) / 8,
                 (long)(iVar5 / 8));
          local_58[(int)local_8c] = lVar4;
          local_8c = local_8c + 1;
        }
      }
    }
LAB_00104b28:
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void LDSketch_get_heavy_keys(LDSketch_t* sk, long long thresh,
	unsigned char* keys, long long* vals,
	int* num_key) {
	int max_array_len = 0;
	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			int len = dyn_tbl_length(sk->tbl[i]);
			if (len > max_array_len) {
				max_array_len = len;
			}
		}
	}

	unsigned char* tmp_keys = (unsigned char*)safe_calloc(
		max_array_len, sk->lgn / 8, std::string("tmp heavy keys").c_str());
	int tmp_n, n = 0;

	for (int i = 0; i < sk->w * sk->h; ++i) {
		if (sk->tbl[i]->max_value >= thresh) {
			dyn_tbl_get_heavy_key(sk->tbl[i], thresh, tmp_keys, &tmp_n);
			for (int j = 0; j < tmp_n; j++) {
				// deduplicate
				int k = 0;
				for (; k < n; k++) {
					if (memcmp(tmp_keys + j * sk->lgn / 8, keys + k * sk->lgn / 8,
						sk->lgn / 8) == 0) {
						break;
					}
				}
				if (k < n) {
					break;
				}

				long long v = LDSketch_up_estimate(sk, tmp_keys + j * sk->lgn / 8);
				if (v >= thresh) {
					memcpy(keys + n * sk->lgn / 8, tmp_keys + j * sk->lgn / 8,
						sk->lgn / 8);
					vals[n] = v;
					n++;
				}
			}
		}
	}

	*num_key = n;
}